

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<float,_4,_4,_0,_4,_4> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
_set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
          (PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *this,
          DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
          *other)

{
  ActualDstType actualDst;
  assign_op<float,_float> local_9;
  
  internal::call_dense_assignment_loop<Eigen::Matrix<float,4,4,0,4,4>>
            ((Matrix<float,_4,_4,_0,_4,_4> *)this,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>
              *)other,&local_9);
  return (Matrix<float,_4,_4,_0,_4,_4> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }